

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  pointer pVVar2;
  value_type vVar3;
  GLuint GVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  pointer pVVar12;
  reference pvVar13;
  long lVar14;
  DILogger local_608;
  DILogger local_488;
  undefined1 local_308 [8];
  DIResult result;
  Vector<float,_4> local_178;
  undefined1 local_168 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_148;
  undefined1 local_138 [8];
  CColorArray bufferRef2;
  Vector<float,_4> local_118;
  undefined1 local_108 [8];
  CColorArray bufferRef1;
  size_t i;
  undefined1 local_e0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> elements;
  DrawElementsIndirectCommand indirectElements;
  undefined1 local_a8 [8];
  CColorArray coords;
  allocator<char> local_59;
  string local_58;
  string local_38;
  CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL> *local_18;
  CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  local_18 = this;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar4 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_38,&local_58,
                     (string *)
                     &coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar4;
  std::__cxx11::string::~string
            ((string *)
             &coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->_program == 0) {
    this_local = (CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL> *)
                 &DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,4,2,2,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a8);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_a8,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar10 << 4,pvVar11,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    elements.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a8);
    elements.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(1,(uint)(sVar10 >> 1) & 0x7fffffff);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_a8);
    i._7_1_ = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 6));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,sVar10,
               (value_type_conflict5 *)((long)&i + 7),(allocator<unsigned_char> *)((long)&i + 6));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 6));
    for (bufferRef1.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVVar2 = bufferRef1.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
        pVVar12 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_e0), pVVar2 < pVVar12;
        bufferRef1.
        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)(bufferRef1.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1)) {
      vVar3 = (value_type)
              bufferRef1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,
                           (size_type)
                           bufferRef1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *pvVar13 = vVar3;
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x14,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBufferSubData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0,0x14,
               &elements.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->_ebo);
    sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,sVar10,pvVar13,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,0x1401,(void *)0x0);
    iVar5 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_118,0.0,0.0,0.0,0.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferRef2.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108,
               (long)((iVar5 * iVar6) / 2),&local_118,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferRef2.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar5 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_148,0.1,0.2,0.3,1.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferTest.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_138,
               (long)((iVar5 * iVar6) / 2),&local_148,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar5 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_178,0.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_168,
               (long)(iVar5 * iVar6),&local_178,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7));
    DIResult::DIResult((DIResult *)local_308);
    iVar5 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_168,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar5,iVar6 / 2,pvVar11);
    uVar7 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    uVar8 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    lVar14 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                       ((DrawIndirectBase *)this,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_168,uVar7,iVar5 / 2,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_138,uVar8,iVar6 / 2);
    DIResult::sub_result(&local_488,(DIResult *)local_308,lVar14);
    DILogger::~DILogger(&local_488);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar9 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
              operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_168,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,(iVar5 + 1) - (iVar5 + 1 >> 0x1f) >> 1,iVar6,
               iVar9 / 2,pvVar11);
    uVar7 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    uVar8 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar6 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    lVar14 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                       ((DrawIndirectBase *)this,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_168,uVar7,iVar5 / 2,
                        (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_108,uVar8,iVar6 / 2);
    DIResult::sub_result(&local_608,(DIResult *)local_308,lVar14);
    DILogger::~DILogger(&local_608);
    this_local = (CIndicesDataTypeUnsignedByte<glcts::(anonymous_namespace)::test_api::GL> *)
                 DIResult::code((DIResult *)local_308);
    DIResult::~DIResult((DIResult *)local_308);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_168);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_138);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 2, 2, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords.size()) / 2;
		indirectElements.primCount					 = 1;
		indirectElements.baseVertex					 = -static_cast<GLint>(coords.size()) / 4;
		indirectElements.firstIndex					 = static_cast<GLuint>(coords.size()) / 4;
		indirectElements.reservedMustBeZero			 = 0;

		std::vector<GLubyte> elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLubyte>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_DRAW_INDIRECT_BUFFER, 0, sizeof(DrawElementsIndirectCommand), &indirectElements);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_BYTE, 0);

		CColorArray bufferRef1(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f));
		CColorArray bufferRef2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef2,
										 getWindowWidth(), getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 1) / 2, getWindowWidth(), getWindowHeight() / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight() / 2, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 2));

		return result.code();
	}